

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void init_once(void)

{
  int iVar1;
  char *__nptr;
  long lVar2;
  ulong uVar3;
  
  iVar1 = pthread_atfork((__prepare *)0x0,(__parent *)0x0,reset_once);
  if (iVar1 != 0) goto LAB_005453d8;
  nthreads = 4;
  __nptr = getenv("UV_THREADPOOL_SIZE");
  if (__nptr == (char *)0x0) {
LAB_0054535e:
    threads = default_threads;
  }
  else {
    nthreads = atoi(__nptr);
    if (nthreads == 0) {
      nthreads = 1;
      goto LAB_0054535e;
    }
    if (nthreads < 0x81) {
      threads = default_threads;
      if (4 < nthreads) goto LAB_0054533e;
    }
    else {
      nthreads = 0x80;
LAB_0054533e:
      threads = default_threads;
      threads = (uv_thread_t *)uv__malloc((ulong)(nthreads << 3));
      if (threads == (uv_thread_t *)0x0) {
        nthreads = 4;
        goto LAB_0054535e;
      }
    }
  }
  iVar1 = uv_cond_init(&cond);
  if ((iVar1 == 0) && (iVar1 = uv_mutex_init(&mutex), iVar1 == 0)) {
    wq[0] = wq;
    wq[1] = wq;
    uVar3 = 0xffffffffffffffff;
    lVar2 = 0;
    do {
      uVar3 = uVar3 + 1;
      if (nthreads <= uVar3) {
        initialized = 1;
        return;
      }
      iVar1 = uv_thread_create((uv_thread_t *)(lVar2 + (long)threads),worker,(void *)0x0);
      lVar2 = lVar2 + 8;
    } while (iVar1 == 0);
  }
LAB_005453d8:
  abort();
}

Assistant:

static void init_once(void) {
#ifndef _WIN32
  /* Re-initialize the threadpool after fork.
   * Note that this discards the global mutex and condition as well
   * as the work queue.
   */
  if (pthread_atfork(NULL, NULL, &reset_once))
    abort();
#endif
  init_threads();
}